

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error doContent(XML_Parser parser,int startTagLevel,ENCODING *enc,char *s,char *end,
                   char **nextPtr)

{
  long *plVar1;
  binding *pbVar2;
  XML_Parser pvVar3;
  char **ppcVar4;
  int iVar5;
  int iVar6;
  XML_Error XVar7;
  code *pcVar8;
  long lVar9;
  undefined8 *puVar10;
  XML_Char *pXVar11;
  NAMED *pNVar12;
  long *plVar13;
  long lVar14;
  long *plVar15;
  char cVar16;
  BINDING *pBVar17;
  long lVar18;
  TAG_NAME *pTVar19;
  undefined8 uVar20;
  XML_Error unaff_R13D;
  BINDING *b;
  char *pcVar21;
  bool bVar22;
  char *next;
  XML_Char ch;
  ICHAR *dataPtr;
  TAG_NAME *local_d0;
  XML_Parser local_c8;
  ENCODING *local_c0;
  TAG_NAME *local_b8;
  char **local_b0;
  int local_a4;
  BINDING *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  TAG_NAME local_88;
  NAMED *local_70;
  BINDING **local_60;
  undefined8 *local_58;
  STRING_POOL *local_50;
  HASH_TABLE *local_48;
  STRING_POOL *local_40;
  char *local_38;
  
  if (*(ENCODING **)((long)parser + 0x118) == enc) {
    local_98 = (undefined8 *)((long)parser + 0x218);
    local_90 = (undefined8 *)((long)parser + 0x220);
  }
  else {
    local_98 = *(undefined8 **)((long)parser + 0x230);
    local_90 = local_98 + 1;
  }
  *local_98 = s;
  local_50 = (STRING_POOL *)((long)parser + 0x418);
  local_58 = (undefined8 *)((long)parser + 0x428);
  local_40 = (STRING_POOL *)((long)parser + 0x330);
  local_48 = (HASH_TABLE *)((long)parser + 0x290);
  local_d0 = (TAG_NAME *)s;
  local_c8 = parser;
  local_c0 = enc;
  local_b0 = nextPtr;
  local_a4 = startTagLevel;
  local_38 = end;
  do {
    pvVar3 = local_c8;
    local_b8 = local_d0;
    iVar5 = (*enc->scanners[1])(enc,(char *)local_d0,end,(char **)&local_b8);
    *local_90 = local_b8;
    switch(iVar5) {
    case 0:
      *local_98 = local_b8;
      XVar7 = XML_ERROR_INVALID_TOKEN;
      goto LAB_004d8539;
    case 1:
      if (*(long *)((long)pvVar3 + 0x68) != 0) goto switchD_004d78b9_caseD_2;
      XVar7 = storeAtts(pvVar3,enc,(char *)local_d0,(TAG_NAME *)0x0,(BINDING **)0x0);
      cVar16 = '\x01';
      if (XVar7 != XML_ERROR_NONE) break;
      goto LAB_004d7b66;
    case 2:
switchD_004d78b9_caseD_2:
LAB_004d7b66:
      pvVar3 = local_c8;
      puVar10 = *(undefined8 **)((long)local_c8 + 0x3d8);
      if (puVar10 == (undefined8 *)0x0) {
        puVar10 = (undefined8 *)(**(code **)((long)local_c8 + 0x18))(0x48);
        if (puVar10 != (undefined8 *)0x0) {
          lVar9 = (**(code **)((long)pvVar3 + 0x18))(0x20);
          puVar10[6] = lVar9;
          if (lVar9 != 0) {
            puVar10[7] = lVar9 + 0x20;
            goto LAB_004d7b85;
          }
        }
LAB_004d823d:
        unaff_R13D = XML_ERROR_NO_MEMORY;
        bVar22 = false;
        enc = local_c0;
      }
      else {
        *(undefined8 *)((long)local_c8 + 0x3d8) = *puVar10;
LAB_004d7b85:
        puVar10[8] = 0;
        *puVar10 = *(undefined8 *)((long)local_c8 + 0x3d0);
        *(undefined8 **)((long)local_c8 + 0x3d0) = puVar10;
        puVar10[4] = 0;
        pcVar21 = (char *)((long)&local_d0->str + (long)local_c0->minBytesPerChar);
        puVar10[1] = pcVar21;
        iVar5 = (*local_c0->nameLength)(local_c0,pcVar21);
        *(int *)(puVar10 + 2) = iVar5;
        if (local_b0 != (char **)0x0) {
          if ((long)(puVar10[7] - puVar10[6]) < (long)(iVar5 + 1)) {
            lVar9 = (**(code **)((long)local_c8 + 0x20))(puVar10[6],(long)(iVar5 << 2));
            puVar10[6] = lVar9;
            if (lVar9 == 0) goto LAB_004d823d;
            puVar10[7] = (iVar5 << 2) + lVar9;
          }
          memcpy((void *)puVar10[6],(void *)puVar10[1],(long)*(int *)(puVar10 + 2));
          puVar10[1] = puVar10[6];
        }
        ppcVar4 = local_b0;
        enc = local_c0;
        pvVar3 = local_c8;
        *(int *)((long)local_c8 + 0x23c) = *(int *)((long)local_c8 + 0x23c) + 1;
        pTVar19 = (TAG_NAME *)(puVar10 + 3);
        if (*(long *)((long)local_c8 + 0x68) == 0) {
          pTVar19->str = (XML_Char *)0x0;
          bVar22 = true;
          if (*(long *)((long)local_c8 + 0xa0) != 0) {
            reportDefault(local_c8,local_c0,(char *)local_d0,(char *)local_b8);
          }
        }
        else {
          local_60 = (BINDING **)(puVar10 + 8);
          do {
            local_a0 = (BINDING *)puVar10[1];
            if (ppcVar4 == (char **)0x0) {
              local_88.str = (XML_Char *)puVar10[6];
            }
            else {
              local_88.str = (XML_Char *)(puVar10[6] + (long)*(int *)(puVar10 + 2));
            }
            pBVar17 = (BINDING *)((long)&local_a0->prefix + (long)*(int *)(puVar10 + 2));
            puVar10[3] = local_88.str;
            (*local_c0->utf8Convert)
                      (local_c0,(char **)&local_a0,(char *)pBVar17,&local_88.str,
                       (char *)(puVar10[7] + -1));
            if (local_a0 == pBVar17) {
              iVar5 = 5;
              bVar22 = false;
            }
            else {
              lVar18 = (long)((*(int *)(puVar10 + 7) - (int)puVar10[6]) * 2);
              lVar9 = (**(code **)((long)pvVar3 + 0x20))(puVar10[6],lVar18);
              puVar10[6] = lVar9;
              iVar5 = 0;
              if (lVar9 == 0) {
                iVar5 = 1;
                bVar22 = false;
                unaff_R13D = XML_ERROR_NO_MEMORY;
              }
              else {
                puVar10[7] = lVar18 + lVar9;
                bVar22 = true;
                if (ppcVar4 != (char **)0x0) {
                  puVar10[1] = lVar9;
                }
              }
            }
            enc = local_c0;
          } while (iVar5 == 0);
          if (iVar5 == 5) {
            *local_88.str = '\0';
            XVar7 = storeAtts(pvVar3,local_c0,(char *)local_d0,pTVar19,local_60);
            if (XVar7 == XML_ERROR_NONE) {
              (**(code **)((long)pvVar3 + 0x68))
                        (*(undefined8 *)((long)pvVar3 + 8),pTVar19->str,
                         *(undefined8 *)((long)pvVar3 + 0x400));
              plVar15 = *(long **)((long)pvVar3 + 0x418);
              if (*(long **)((long)pvVar3 + 0x420) == (long *)0x0) {
LAB_004d85f2:
                *(long **)((long)pvVar3 + 0x420) = plVar15;
              }
              else {
                plVar1 = plVar15;
                plVar13 = *(long **)((long)pvVar3 + 0x420);
                if (plVar15 != (long *)0x0) {
                  do {
                    plVar15 = plVar1;
                    plVar1 = (long *)*plVar15;
                    *plVar15 = (long)plVar13;
                    plVar13 = plVar15;
                  } while (plVar1 != (long *)0x0);
                  goto LAB_004d85f2;
                }
              }
              *(undefined8 *)((long)pvVar3 + 0x418) = 0;
              local_58[2] = 0;
              *local_58 = 0;
              local_58[1] = 0;
              bVar22 = true;
            }
            else {
              bVar22 = false;
              unaff_R13D = XVar7;
            }
          }
        }
      }
      cVar16 = '\x01';
      end = local_38;
      XVar7 = unaff_R13D;
      if (bVar22) {
LAB_004d86f4:
        local_d0 = local_b8;
        *local_98 = local_b8;
        cVar16 = '\0';
        XVar7 = unaff_R13D;
      }
      break;
    case 3:
      if (*(long *)((long)pvVar3 + 0x68) != 0) goto switchD_004d78b9_caseD_4;
      XVar7 = storeAtts(pvVar3,enc,(char *)local_d0,(TAG_NAME *)0x0,(BINDING **)0x0);
      cVar16 = '\x01';
      if (XVar7 != XML_ERROR_NONE) break;
      goto LAB_004d7a0c;
    case 4:
switchD_004d78b9_caseD_4:
LAB_004d7a0c:
      if ((*(long *)((long)local_c8 + 0x68) == 0) && (*(long *)((long)local_c8 + 0x70) == 0)) {
        if (*(long *)((long)local_c8 + 0xa0) != 0) {
          reportDefault(local_c8,enc,(char *)local_d0,(char *)local_b8);
        }
      }
      else {
        pcVar21 = (char *)((long)&local_d0->str + (long)enc->minBytesPerChar);
        local_a0 = (BINDING *)0x0;
        iVar5 = (*enc->nameLength)(enc,pcVar21);
        local_88.str = poolStoreString(local_50,enc,pcVar21,pcVar21 + iVar5);
        pvVar3 = local_c8;
        cVar16 = '\x01';
        if (local_88.str == (XML_Char *)0x0) {
          bVar22 = false;
          unaff_R13D = XML_ERROR_NO_MEMORY;
        }
        else {
          *(undefined8 *)((long)local_c8 + 0x438) = *(undefined8 *)((long)local_c8 + 0x430);
          XVar7 = storeAtts(local_c8,enc,(char *)local_d0,&local_88,&local_a0);
          if (XVar7 == XML_ERROR_NONE) {
            *(undefined8 *)((long)pvVar3 + 0x438) = *(undefined8 *)((long)pvVar3 + 0x430);
            if (*(code **)((long)pvVar3 + 0x68) != (code *)0x0) {
              (**(code **)((long)pvVar3 + 0x68))
                        (*(undefined8 *)((long)pvVar3 + 8),local_88.str,
                         *(undefined8 *)((long)pvVar3 + 0x400));
            }
            if (*(long *)((long)pvVar3 + 0x70) != 0) {
              if (*(long *)((long)pvVar3 + 0x68) != 0) {
                *local_98 = *local_90;
              }
              (**(code **)((long)pvVar3 + 0x70))(*(undefined8 *)((long)pvVar3 + 8),local_88.str);
            }
            plVar15 = *(long **)((long)pvVar3 + 0x418);
            if (*(long **)((long)pvVar3 + 0x420) == (long *)0x0) {
LAB_004d8358:
              *(long **)((long)pvVar3 + 0x420) = plVar15;
            }
            else {
              plVar1 = plVar15;
              plVar13 = *(long **)((long)pvVar3 + 0x420);
              if (plVar15 != (long *)0x0) {
                do {
                  plVar15 = plVar1;
                  plVar1 = (long *)*plVar15;
                  *plVar15 = (long)plVar13;
                  plVar13 = plVar15;
                } while (plVar1 != (long *)0x0);
                goto LAB_004d8358;
              }
            }
            local_50->blocks = (BLOCK *)0x0;
            local_58[2] = 0;
            *local_58 = 0;
            local_58[1] = 0;
            enc = local_c0;
            pBVar17 = local_a0;
            while (local_c0 = enc, pBVar17 != (BINDING *)0x0) {
              if (*(code **)((long)pvVar3 + 0xd0) != (code *)0x0) {
                (**(code **)((long)pvVar3 + 0xd0))
                          (*(undefined8 *)((long)pvVar3 + 8),pBVar17->prefix->name);
              }
              pbVar2 = pBVar17->nextTagBinding;
              pBVar17->nextTagBinding = *(binding **)((long)pvVar3 + 1000);
              *(BINDING **)((long)pvVar3 + 1000) = pBVar17;
              pBVar17->prefix->binding = pBVar17->prevPrefixBinding;
              enc = local_c0;
              pBVar17 = pbVar2;
            }
            local_a0 = (BINDING *)0x0;
            bVar22 = true;
          }
          else {
            bVar22 = false;
            unaff_R13D = XVar7;
          }
        }
        XVar7 = unaff_R13D;
        if (!bVar22) break;
      }
      if (*(int *)((long)local_c8 + 0x23c) == 0) {
        XVar7 = epilogProcessor(local_c8,(char *)local_b8,end,local_b0);
        goto LAB_004d8539;
      }
      goto LAB_004d86f4;
    case 5:
      cVar16 = '\x01';
      XVar7 = XML_ERROR_ASYNC_ENTITY;
      if (*(int *)((long)pvVar3 + 0x23c) != local_a4) {
        puVar10 = *(undefined8 **)((long)local_c8 + 0x3d0);
        *(undefined8 *)((long)local_c8 + 0x3d0) = *puVar10;
        *puVar10 = *(undefined8 *)((long)local_c8 + 0x3d8);
        *(undefined8 **)((long)local_c8 + 0x3d8) = puVar10;
        pcVar21 = (char *)((long)&local_d0->str + (long)enc->minBytesPerChar * 2);
        iVar5 = (*enc->nameLength)(enc,pcVar21);
        if ((iVar5 == *(int *)(puVar10 + 2)) &&
           (iVar5 = bcmp((void *)puVar10[1],pcVar21,(long)iVar5), pvVar3 = local_c8, iVar5 == 0)) {
          *(int *)((long)local_c8 + 0x23c) = *(int *)((long)local_c8 + 0x23c) + -1;
          if ((*(long *)((long)local_c8 + 0x70) == 0) || (lVar9 = puVar10[3], lVar9 == 0)) {
            if (*(long *)((long)local_c8 + 0xa0) != 0) {
              reportDefault(local_c8,local_c0,(char *)local_d0,(char *)local_b8);
            }
          }
          else {
            lVar18 = puVar10[4];
            if (lVar18 != 0) {
              iVar5 = *(int *)(puVar10 + 5);
              lVar14 = 0;
              do {
                cVar16 = *(char *)(lVar18 + lVar14);
                *(char *)(lVar9 + iVar5 + lVar14) = cVar16;
                lVar14 = lVar14 + 1;
              } while (cVar16 != '\0');
            }
            (**(code **)((long)local_c8 + 0x70))(*(undefined8 *)((long)local_c8 + 8),puVar10[3]);
          }
          while (plVar15 = (long *)puVar10[8], plVar15 != (long *)0x0) {
            if (*(code **)((long)pvVar3 + 0xd0) != (code *)0x0) {
              (**(code **)((long)pvVar3 + 0xd0))
                        (*(undefined8 *)((long)pvVar3 + 8),*(undefined8 *)*plVar15);
            }
            puVar10[8] = *(undefined8 *)(puVar10[8] + 8);
            plVar15[1] = *(long *)((long)pvVar3 + 1000);
            *(long **)((long)pvVar3 + 1000) = plVar15;
            *(long *)(*plVar15 + 8) = plVar15[2];
          }
          bVar22 = true;
          if (*(int *)((long)pvVar3 + 0x23c) == 0) {
            unaff_R13D = epilogProcessor(local_c8,(char *)local_b8,end,local_b0);
            goto LAB_004d7d23;
          }
        }
        else {
          *local_98 = pcVar21;
          unaff_R13D = XML_ERROR_TAG_MISMATCH;
LAB_004d7d23:
          bVar22 = false;
        }
        cVar16 = '\x01';
        enc = local_c0;
        XVar7 = unaff_R13D;
        if (bVar22) goto LAB_004d86f4;
      }
      break;
    case 6:
      pcVar8 = *(code **)((long)pvVar3 + 0x78);
      if (pcVar8 == (code *)0x0) goto switchD_004d78b9_default;
      if (enc->isUtf8 != '\0') {
        uVar20 = *(undefined8 *)((long)pvVar3 + 8);
        iVar5 = (int)local_b8 - (int)local_d0;
        pTVar19 = local_d0;
        goto LAB_004d79d6;
      }
      while( true ) {
        local_88.str = *(XML_Char **)((long)pvVar3 + 0x58);
        (*enc->utf8Convert)(enc,(char **)&local_d0,(char *)local_b8,&local_88.str,
                            *(char **)((long)pvVar3 + 0x60));
        *local_90 = local_d0;
        (**(code **)((long)pvVar3 + 0x78))
                  (*(undefined8 *)((long)pvVar3 + 8),*(undefined8 *)((long)pvVar3 + 0x58),
                   (int)local_88.str - (int)*(undefined8 *)((long)pvVar3 + 0x58));
        if (local_d0 == local_b8) break;
        *local_98 = local_d0;
      }
      goto LAB_004d86f4;
    case 7:
      pcVar8 = *(code **)((long)pvVar3 + 0x78);
      if (pcVar8 != (code *)0x0) {
        local_88.str = (XML_Char *)CONCAT71(local_88.str._1_7_,10);
        uVar20 = *(undefined8 *)((long)pvVar3 + 8);
        iVar5 = 1;
        pTVar19 = &local_88;
LAB_004d79d6:
        (*pcVar8)(uVar20,pTVar19,iVar5);
        goto LAB_004d86f4;
      }
    default:
switchD_004d78b9_default:
      if (*(long *)((long)pvVar3 + 0xa0) != 0) {
        reportDefault(pvVar3,enc,(char *)local_d0,(char *)local_b8);
      }
      goto LAB_004d86f4;
    case 8:
      if (*(code **)((long)pvVar3 + 0x90) == (code *)0x0) {
        if (*(long *)((long)pvVar3 + 0xa0) != 0) {
          reportDefault(pvVar3,enc,(char *)local_d0,(char *)local_b8);
        }
      }
      else {
        (**(code **)((long)pvVar3 + 0x90))(*(undefined8 *)((long)pvVar3 + 8));
      }
      XVar7 = doCdataSection(pvVar3,enc,(char **)&local_b8,end,local_b0);
      if (local_b8 == (TAG_NAME *)0x0) {
        *(code **)((long)pvVar3 + 0x208) = cdataSectionProcessor;
        unaff_R13D = XVar7;
      }
      cVar16 = '\x01';
      XVar7 = unaff_R13D;
      if (local_b8 != (TAG_NAME *)0x0) goto LAB_004d86f4;
      break;
    case 9:
      iVar5 = (*enc->predefinedEntityName)
                        (enc,(char *)((long)&local_d0->str + (long)enc->minBytesPerChar),
                         (char *)((long)local_b8 - (long)enc->minBytesPerChar));
      local_a0 = (BINDING *)CONCAT71(local_a0._1_7_,(char)iVar5);
      if ((char)iVar5 == '\0') {
        pXVar11 = poolStoreString(local_40,enc,
                                  (char *)((long)&local_d0->str + (long)enc->minBytesPerChar),
                                  (char *)((long)local_b8 - (long)enc->minBytesPerChar));
        cVar16 = '\x01';
        if (pXVar11 == (XML_Char *)0x0) {
          XVar7 = XML_ERROR_NO_MEMORY;
        }
        else {
          pNVar12 = lookup(local_48,pXVar11,0);
          pvVar3 = local_c8;
          *(undefined8 *)((long)local_c8 + 0x348) = *(undefined8 *)((long)local_c8 + 0x350);
          if (pNVar12 == (NAMED *)0x0) {
            XVar7 = XML_ERROR_UNDEFINED_ENTITY;
            if ((*(int *)((long)local_c8 + 0x360) == 0) && (*(int *)((long)local_c8 + 0x364) == 0))
            {
              if (*(long *)((long)local_c8 + 0xa0) != 0) {
                reportDefault(local_c8,local_c0,(char *)local_d0,(char *)local_b8);
              }
LAB_004d86e4:
              cVar16 = '\x04';
              XVar7 = unaff_R13D;
            }
          }
          else {
            XVar7 = XML_ERROR_RECURSIVE_ENTITY_REF;
            if ((*(char *)&pNVar12[7].name == '\0') &&
               (XVar7 = XML_ERROR_BINARY_ENTITY_REF, pNVar12[6].name == (KEY)0x0)) {
              if (pNVar12[1].name == (KEY)0x0) {
                if (*(long *)((long)local_c8 + 0xe0) == 0) {
                  if (*(long *)((long)local_c8 + 0xa0) != 0) {
                    reportDefault(local_c8,local_c0,(char *)local_d0,(char *)local_b8);
                  }
                  goto LAB_004d86e4;
                }
                *(undefined1 *)&pNVar12[7].name = 1;
                pXVar11 = getContext(local_c8);
                *(undefined1 *)&pNVar12[7].name = 0;
                cVar16 = '\x01';
                if (pXVar11 == (XML_Char *)0x0) {
                  bVar22 = false;
                  unaff_R13D = XML_ERROR_NO_MEMORY;
                }
                else {
                  iVar5 = (**(code **)((long)pvVar3 + 0xe0))
                                    (*(undefined8 *)((long)pvVar3 + 0xe8),pXVar11,pNVar12[4].name,
                                     pNVar12[3].name);
                  if (iVar5 == 0) {
                    bVar22 = false;
                    unaff_R13D = XML_ERROR_EXTERNAL_ENTITY_HANDLING;
                  }
                  else {
                    *(undefined8 *)((long)pvVar3 + 0x430) = *(undefined8 *)((long)pvVar3 + 0x438);
                    bVar22 = true;
                  }
                }
              }
              else if ((*(long *)((long)local_c8 + 0xa0) == 0) ||
                      (*(int *)((long)local_c8 + 0x238) != 0)) {
                *(undefined1 *)&pNVar12[7].name = 1;
                local_88._16_8_ = *(undefined8 *)((long)local_c8 + 0x230);
                *(TAG_NAME **)((long)local_c8 + 0x230) = &local_88;
                local_88.str = (XML_Char *)0x0;
                local_88.localPart = (XML_Char *)0x0;
                local_70 = pNVar12;
                XVar7 = doContent(local_c8,*(int *)((long)local_c8 + 0x23c),
                                  *(ENCODING **)((long)local_c8 + 0x1b8),pNVar12[1].name,
                                  pNVar12[1].name + *(int *)&pNVar12[2].name,(char **)0x0);
                *(undefined1 *)&pNVar12[7].name = 0;
                *(undefined8 *)((long)pvVar3 + 0x230) = local_88._16_8_;
                bVar22 = XVar7 == XML_ERROR_NONE;
                cVar16 = !bVar22;
                if (!bVar22) {
                  unaff_R13D = XVar7;
                }
              }
              else {
                reportDefault(local_c8,local_c0,(char *)local_d0,(char *)local_b8);
                cVar16 = '\x04';
                bVar22 = false;
              }
              XVar7 = unaff_R13D;
              if (bVar22) goto LAB_004d86e4;
            }
          }
        }
      }
      else {
        XVar7 = unaff_R13D;
        if (*(code **)((long)pvVar3 + 0x78) == (code *)0x0) {
          cVar16 = '\x04';
          if (*(long *)((long)pvVar3 + 0xa0) != 0) {
            reportDefault(pvVar3,enc,(char *)local_d0,(char *)local_b8);
          }
        }
        else {
          (**(code **)((long)pvVar3 + 0x78))(*(undefined8 *)((long)pvVar3 + 8),&local_a0,1);
          cVar16 = '\x04';
        }
      }
      unaff_R13D = XVar7;
      enc = local_c0;
      XVar7 = unaff_R13D;
      if (cVar16 == '\x04') goto LAB_004d86f4;
      break;
    case 10:
      iVar5 = (*enc->charRefNumber)(enc,(char *)local_d0);
      if (iVar5 < 0) {
        unaff_R13D = XML_ERROR_BAD_CHAR_REF;
      }
      else {
        pcVar8 = *(code **)((long)pvVar3 + 0x78);
        if (pcVar8 == (code *)0x0) {
          if (*(long *)((long)pvVar3 + 0xa0) != 0) {
            reportDefault(pvVar3,local_c0,(char *)local_d0,(char *)local_b8);
          }
        }
        else {
          local_60 = *(BINDING ***)((long)pvVar3 + 8);
          iVar6 = cm_expat_XmlUtf8Encode(iVar5,(char *)&local_88);
          (*pcVar8)(local_60,&local_88,iVar6);
        }
      }
      cVar16 = '\x01';
      enc = local_c0;
      XVar7 = unaff_R13D;
      if (-1 < iVar5) goto LAB_004d86f4;
      break;
    case 0xb:
      iVar5 = reportProcessingInstruction(pvVar3,enc,(char *)local_d0,(char *)local_b8);
      goto LAB_004d7c81;
    case 0xc:
      XVar7 = XML_ERROR_MISPLACED_XML_PI;
LAB_004d8539:
      cVar16 = '\x01';
      break;
    case 0xd:
      iVar5 = reportComment(pvVar3,enc,(char *)local_d0,(char *)local_b8);
LAB_004d7c81:
      if (iVar5 == 0) {
        cVar16 = '\x01';
        XVar7 = XML_ERROR_NO_MEMORY;
        break;
      }
      goto LAB_004d86f4;
    case -5:
      if (local_b0 != (char **)0x0) {
LAB_004d7c1e:
        *local_b0 = (char *)local_d0;
        XVar7 = XML_ERROR_NONE;
        goto LAB_004d8539;
      }
      if (*(code **)((long)pvVar3 + 0x78) == (code *)0x0) {
        if (*(long *)((long)pvVar3 + 0xa0) != 0) {
          reportDefault(pvVar3,enc,(char *)local_d0,end);
        }
      }
      else if (enc->isUtf8 == '\0') {
        local_88.str = *(XML_Char **)((long)pvVar3 + 0x58);
        (*enc->utf8Convert)(enc,(char **)&local_d0,end,&local_88.str,*(char **)((long)pvVar3 + 0x60)
                           );
        (**(code **)((long)pvVar3 + 0x78))
                  (*(undefined8 *)((long)pvVar3 + 8),*(undefined8 *)((long)pvVar3 + 0x58),
                   (int)local_88.str - (int)*(undefined8 *)((long)pvVar3 + 0x58));
      }
      else {
        (**(code **)((long)pvVar3 + 0x78))
                  (*(undefined8 *)((long)pvVar3 + 8),local_d0,(int)end - (int)local_d0);
      }
      if (local_a4 == 0) {
        *local_98 = end;
        goto LAB_004d8533;
      }
      cVar16 = '\x01';
      XVar7 = XML_ERROR_NONE;
      if (*(int *)((long)pvVar3 + 0x23c) != local_a4) {
        *local_98 = end;
        XVar7 = XML_ERROR_ASYNC_ENTITY;
      }
      break;
    case -4:
      if (local_b0 != (char **)0x0) goto LAB_004d7c1e;
      if (local_a4 < 1) goto LAB_004d8533;
LAB_004d8312:
      XVar7 = XML_ERROR_ASYNC_ENTITY;
      if (*(int *)((long)pvVar3 + 0x23c) == local_a4) {
        XVar7 = XML_ERROR_NONE;
      }
      goto LAB_004d8539;
    case -3:
      if (local_b0 != (char **)0x0) goto LAB_004d7c1e;
      *local_90 = end;
      if (*(code **)((long)pvVar3 + 0x78) == (code *)0x0) {
        if (*(long *)((long)pvVar3 + 0xa0) != 0) {
          reportDefault(pvVar3,enc,(char *)local_d0,end);
        }
      }
      else {
        local_88.str = (XML_Char *)CONCAT71(local_88.str._1_7_,10);
        (**(code **)((long)pvVar3 + 0x78))(*(undefined8 *)((long)pvVar3 + 8),&local_88,1);
      }
      if (local_a4 != 0) goto LAB_004d8312;
LAB_004d8533:
      XVar7 = XML_ERROR_NO_ELEMENTS;
      goto LAB_004d8539;
    case -2:
      if (local_b0 != (char **)0x0) goto LAB_004d7c1e;
      XVar7 = XML_ERROR_PARTIAL_CHAR;
      goto LAB_004d8539;
    case -1:
      if (local_b0 != (char **)0x0) goto LAB_004d7c1e;
      XVar7 = XML_ERROR_UNCLOSED_TOKEN;
      goto LAB_004d8539;
    }
    unaff_R13D = XVar7;
    if (cVar16 != '\0') {
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

static enum XML_Error
doContent(XML_Parser parser,
          int startTagLevel,
          const ENCODING *enc,
          const char *s,
          const char *end,
          const char **nextPtr)
{
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  for (;;) {
    const char *next = s; /* XmlContentTok doesn't always set the last arg */
    int tok = XmlContentTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_TRAILING_CR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      *eventEndPP = end;
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, end);
      if (startTagLevel == 0)
        return XML_ERROR_NO_ELEMENTS;
      if (tagLevel != startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (startTagLevel > 0) {
        if (tagLevel != startTagLevel)
          return XML_ERROR_ASYNC_ENTITY;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = XmlPredefinedEntityName(enc,
                                              s + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (characterDataHandler)
            characterDataHandler(handlerArg, &ch, 1);
          else if (defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        name = poolStoreString(&dtd.pool, enc,
                                s + enc->minBytesPerChar,
                                next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.generalEntities, name, 0);
        poolDiscard(&dtd.pool);
        if (!entity) {
          if (dtd.complete || dtd.standalone)
            return XML_ERROR_UNDEFINED_ENTITY;
          if (defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        if (entity->open)
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        if (entity->notation)
          return XML_ERROR_BINARY_ENTITY_REF;
        if (entity) {
          if (entity->textPtr) {
            enum XML_Error result;
            OPEN_INTERNAL_ENTITY openEntity;
            if (defaultHandler && !defaultExpandInternalEntities) {
              reportDefault(parser, enc, s, next);
              break;
            }
            entity->open = 1;
            openEntity.next = openInternalEntities;
            openInternalEntities = &openEntity;
            openEntity.entity = entity;
            openEntity.internalEventPtr = 0;
            openEntity.internalEventEndPtr = 0;
            result = doContent(parser,
                               tagLevel,
                               internalEncoding,
                               (char *)entity->textPtr,
                               (char *)(entity->textPtr + entity->textLen),
                               0);
            entity->open = 0;
            openInternalEntities = openEntity.next;
            if (result)
              return result;
          }
          else if (externalEntityRefHandler) {
            const XML_Char *context;
            entity->open = 1;
            context = getContext(parser);
            entity->open = 0;
            if (!context)
              return XML_ERROR_NO_MEMORY;
            if (!externalEntityRefHandler(externalEntityRefHandlerArg,
                                          context,
                                          entity->base,
                                          entity->systemId,
                                          entity->publicId))
              return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
            poolDiscard(&tempPool);
          }
          else if (defaultHandler)
            reportDefault(parser, enc, s, next);
        }
        break;
      }
    case XML_TOK_START_TAG_WITH_ATTS:
      if (!startElementHandler) {
        enum XML_Error result = storeAtts(parser, enc, s, 0, 0);
        if (result)
          return result;
      }
      /* fall through */
    case XML_TOK_START_TAG_NO_ATTS:
      {
        TAG *tag;
        if (freeTagList) {
          tag = freeTagList;
          freeTagList = freeTagList->parent;
        }
        else {
          tag = MALLOC(sizeof(TAG));
          if (!tag)
            return XML_ERROR_NO_MEMORY;
          tag->buf = MALLOC(INIT_TAG_BUF_SIZE);
          if (!tag->buf)
            return XML_ERROR_NO_MEMORY;
          tag->bufEnd = tag->buf + INIT_TAG_BUF_SIZE;
        }
        tag->bindings = 0;
        tag->parent = tagStack;
        tagStack = tag;
        tag->name.localPart = 0;
        tag->rawName = s + enc->minBytesPerChar;
        tag->rawNameLength = XmlNameLength(enc, tag->rawName);
        if (nextPtr) {
          /* Need to guarantee that:
             tag->buf + ROUND_UP(tag->rawNameLength, sizeof(XML_Char)) <= tag->bufEnd - sizeof(XML_Char) */
          if (tag->rawNameLength + (int)(sizeof(XML_Char) - 1) + (int)sizeof(XML_Char) > tag->bufEnd - tag->buf) {
            int bufSize = tag->rawNameLength * 4;
            bufSize = ROUND_UP(bufSize, sizeof(XML_Char));
            tag->buf = REALLOC(tag->buf, bufSize);
            if (!tag->buf)
              return XML_ERROR_NO_MEMORY;
            tag->bufEnd = tag->buf + bufSize;
          }
          memcpy(tag->buf, tag->rawName, tag->rawNameLength);
          tag->rawName = tag->buf;
        }
        ++tagLevel;
        if (startElementHandler) {
          enum XML_Error result;
          XML_Char *toPtr;
          for (;;) {
            const char *rawNameEnd = tag->rawName + tag->rawNameLength;
            const char *fromPtr = tag->rawName;
            int bufSize;
            if (nextPtr)
              toPtr = (XML_Char *)(tag->buf + ROUND_UP(tag->rawNameLength, sizeof(XML_Char)));
            else
              toPtr = (XML_Char *)tag->buf;
            tag->name.str = toPtr;
            XmlConvert(enc,
                       &fromPtr, rawNameEnd,
                       (ICHAR **)&toPtr, (ICHAR *)tag->bufEnd - 1);
            if (fromPtr == rawNameEnd)
              break;
            bufSize = (tag->bufEnd - tag->buf) << 1;
            tag->buf = REALLOC(tag->buf, bufSize);
            if (!tag->buf)
              return XML_ERROR_NO_MEMORY;
            tag->bufEnd = tag->buf + bufSize;
            if (nextPtr)
              tag->rawName = tag->buf;
          }
          *toPtr = XML_T('\0');
          result = storeAtts(parser, enc, s, &(tag->name), &(tag->bindings));
          if (result)
            return result;
          startElementHandler(handlerArg, tag->name.str, (const XML_Char **)atts);
          poolClear(&tempPool);
        }
        else {
          tag->name.str = 0;
          if (defaultHandler)
            reportDefault(parser, enc, s, next);
        }
        break;
      }
    case XML_TOK_EMPTY_ELEMENT_WITH_ATTS:
      if (!startElementHandler) {
        enum XML_Error result = storeAtts(parser, enc, s, 0, 0);
        if (result)
          return result;
      }
      /* fall through */
    case XML_TOK_EMPTY_ELEMENT_NO_ATTS:
      if (startElementHandler || endElementHandler) {
        const char *rawName = s + enc->minBytesPerChar;
        enum XML_Error result;
        BINDING *bindings = 0;
        TAG_NAME name;
        name.str = poolStoreString(&tempPool, enc, rawName,
                                   rawName + XmlNameLength(enc, rawName));
        if (!name.str)
          return XML_ERROR_NO_MEMORY;
        poolFinish(&tempPool);
        result = storeAtts(parser, enc, s, &name, &bindings);
        if (result)
          return result;
        poolFinish(&tempPool);
        if (startElementHandler)
          startElementHandler(handlerArg, name.str, (const XML_Char **)atts);
        if (endElementHandler) {
          if (startElementHandler)
            *eventPP = *eventEndPP;
          endElementHandler(handlerArg, name.str);
        }
        poolClear(&tempPool);
        while (bindings) {
          BINDING *b = bindings;
          if (endNamespaceDeclHandler)
            endNamespaceDeclHandler(handlerArg, b->prefix->name);
          bindings = bindings->nextTagBinding;
          b->nextTagBinding = freeBindingList;
          freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      if (tagLevel == 0)
        return epilogProcessor(parser, next, end, nextPtr);
      break;
    case XML_TOK_END_TAG:
      if (tagLevel == startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      else {
        int len;
        const char *rawName;
        TAG *tag = tagStack;
        tagStack = tag->parent;
        tag->parent = freeTagList;
        freeTagList = tag;
        rawName = s + enc->minBytesPerChar*2;
        len = XmlNameLength(enc, rawName);
        if (len != tag->rawNameLength
            || memcmp(tag->rawName, rawName, len) != 0) {
          *eventPP = rawName;
          return XML_ERROR_TAG_MISMATCH;
        }
        --tagLevel;
        if (endElementHandler && tag->name.str) {
          if (tag->name.localPart) {
            XML_Char *to = (XML_Char *)tag->name.str + tag->name.uriLen;
            const XML_Char *from = tag->name.localPart;
            while ((*to++ = *from++) != 0)
              ;
          }
          endElementHandler(handlerArg, tag->name.str);
        }
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
        while (tag->bindings) {
          BINDING *b = tag->bindings;
          if (endNamespaceDeclHandler)
            endNamespaceDeclHandler(handlerArg, b->prefix->name);
          tag->bindings = tag->bindings->nextTagBinding;
          b->nextTagBinding = freeBindingList;
          freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
        if (tagLevel == 0)
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_CHAR_REF:
      {
        int n = XmlCharRefNumber(enc, s);
        if (n < 0)
          return XML_ERROR_BAD_CHAR_REF;
        if (characterDataHandler) {
          XML_Char buf[XML_ENCODE_MAX];
          characterDataHandler(handlerArg, buf, XmlEncode(n, (ICHAR *)buf));
        }
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_XML_DECL:
      return XML_ERROR_MISPLACED_XML_PI;
    case XML_TOK_DATA_NEWLINE:
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_CDATA_SECT_OPEN:
      {
        enum XML_Error result;
        if (startCdataSectionHandler)
          startCdataSectionHandler(handlerArg);
#if 0
        /* Suppose you doing a transformation on a document that involves
           changing only the character data.  You set up a defaultHandler
           and a characterDataHandler.  The defaultHandler simply copies
           characters through.  The characterDataHandler does the transformation
           and writes the characters out escaping them as necessary.  This case
           will fail to work if we leave out the following two lines (because &
           and < inside CDATA sections will be incorrectly escaped).

           However, now we have a start/endCdataSectionHandler, so it seems
           easier to let the user deal with this. */

        else if (characterDataHandler)
          characterDataHandler(handlerArg, dataBuf, 0);
#endif
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
        result = doCdataSection(parser, enc, &next, end, nextPtr);
        if (!next) {
          processor = cdataSectionProcessor;
          return result;
        }
      }
      break;
    case XML_TOK_TRAILING_RSQB:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          ICHAR *dataPtr = (ICHAR *)dataBuf;
          XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)dataBufEnd);
          characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)end - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, end);
      if (startTagLevel == 0) {
        *eventPP = end;
        return XML_ERROR_NO_ELEMENTS;
      }
      if (tagLevel != startTagLevel) {
        *eventPP = end;
        return XML_ERROR_ASYNC_ENTITY;
      }
      return XML_ERROR_NONE;
    case XML_TOK_DATA_CHARS:
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          for (;;) {
            ICHAR *dataPtr = (ICHAR *)dataBuf;
            XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)dataBufEnd);
            *eventEndPP = s;
            characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
            if (s == next)
              break;
            *eventPP = s;
          }
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)next - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    default:
      if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    }
    *eventPP = s = next;
  }
  /* not reached */
}